

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

int uv_thread_create_ex(uv_thread_t *tid,uv_thread_options_t *params,_func_void_void_ptr *entry,
                       void *arg)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 __stacksize;
  pthread_attr_t attr_storage;
  pthread_attr_t local_60;
  
  if (((params->flags & 1) == 0) || (sVar1 = params->stack_size, sVar1 == 0)) {
    iVar2 = getrlimit(RLIMIT_STACK,(rlimit *)&local_60);
    if (iVar2 != 0) goto LAB_00528e29;
    __stacksize = 0x200000;
    if (local_60.__align != 0xffffffffffffffff) {
      iVar2 = getpagesize();
      uVar3 = local_60.__align - (ulong)local_60.__align % (ulong)(long)iVar2;
      local_60.__align = uVar3;
      if (0x1fff < uVar3) {
        uVar4 = __sysconf(0x4b);
        __stacksize = 0x200000;
        if (uVar4 <= uVar3) {
          __stacksize = local_60.__align;
        }
      }
    }
  }
  else {
    iVar2 = getpagesize();
    __stacksize = -(long)iVar2 & ((long)iVar2 + sVar1) - 1;
    uVar3 = __sysconf(0x4b);
    if ((ulong)__stacksize < uVar3) {
      __stacksize = __sysconf(0x4b);
    }
  }
  if (__stacksize != 0) {
    iVar2 = pthread_attr_init(&local_60);
    if (iVar2 == 0) {
      iVar2 = pthread_attr_setstacksize(&local_60,__stacksize);
      if (iVar2 == 0) {
        iVar2 = pthread_create(tid,&local_60,(__start_routine *)entry,arg);
        pthread_attr_destroy(&local_60);
        goto LAB_00528e17;
      }
    }
LAB_00528e29:
    abort();
  }
  iVar2 = pthread_create(tid,(pthread_attr_t *)0x0,(__start_routine *)entry,arg);
LAB_00528e17:
  return -iVar2;
}

Assistant:

int uv_thread_create_ex(uv_thread_t* tid,
                        const uv_thread_options_t* params,
                        void (*entry)(void *arg),
                        void *arg) {
  int err;
  pthread_attr_t* attr;
  pthread_attr_t attr_storage;
  size_t pagesize;
  size_t stack_size;

  stack_size =
      params->flags & UV_THREAD_HAS_STACK_SIZE ? params->stack_size : 0;

  attr = NULL;
  if (stack_size == 0) {
    stack_size = thread_stack_size();
  } else {
    pagesize = (size_t)getpagesize();
    /* Round up to the nearest page boundary. */
    stack_size = (stack_size + pagesize - 1) &~ (pagesize - 1);
#ifdef PTHREAD_STACK_MIN
    if (stack_size < PTHREAD_STACK_MIN)
      stack_size = PTHREAD_STACK_MIN;
#endif
  }

  if (stack_size > 0) {
    attr = &attr_storage;

    if (pthread_attr_init(attr))
      abort();

    if (pthread_attr_setstacksize(attr, stack_size))
      abort();
  }

  err = pthread_create(tid, attr, (void*(*)(void*)) entry, arg);

  if (attr != NULL)
    pthread_attr_destroy(attr);

  return UV__ERR(err);
}